

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O2

void __thiscall tst_helpers_connect::rejectTwoSendersDestroyed(tst_helpers_connect *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Object *pOVar4;
  QThread *p_00;
  QObject *pQVar5;
  QEvent *this_00;
  offset_in_Object_to_subr in_RCX;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar6;
  PromiseFromSignal<void_(Object::*)()> p;
  bool local_34 [4];
  Object *s1;
  Object *s0;
  code *local_20;
  undefined8 uStack_18;
  
  pOVar4 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar4 = 0;
  *(undefined8 *)&pOVar4->field_0x8 = 0;
  *(undefined8 *)&pOVar4->m_connections = 0;
  Object::Object(pOVar4);
  s0 = pOVar4;
  pOVar4 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar4 = 0;
  *(undefined8 *)&pOVar4->field_0x8 = 0;
  *(undefined8 *)&pOVar4->m_connections = 0;
  Object::Object(pOVar4);
  s1 = pOVar4;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&p,p_00);
  if (((p.super_QPromiseBase<void>._vptr_QPromiseBase != (_func_int **)0x0) &&
      (iVar3 = *(int *)((long)p.super_QPromiseBase<void>._vptr_QPromiseBase + 4),
      in_RCX = (offset_in_Object_to_subr)CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0),
      p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0 && iVar3 != 0)) &&
     (cVar1 = QThread::isFinished(), cVar1 == '\0')) {
    if ((p.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) ||
       (QVar6 = p.super_QPromiseBase<void>.m_d,
       *(int *)((long)p.super_QPromiseBase<void>._vptr_QPromiseBase + 4) == 0)) {
      QVar6.d = (PromiseData<void> *)(QThread *)0x0;
    }
    pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)QVar6.d);
    if ((pQVar5 != (QObject *)0x0) || (cVar1 = QCoreApplication::closingDown(), cVar1 == '\0')) {
      this_00 = (QEvent *)operator_new(0x20);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_00127630;
      *(Object ***)(this_00 + 0x10) = &s1;
      *(Object ***)(this_00 + 0x18) = &s0;
      QCoreApplication::postEvent(pQVar5,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&p);
  local_20 = Object::twoArgsSignal;
  uStack_18 = 0;
  QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)s0,s1,in_RCX);
  bVar2 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_20 = (code *)CONCAT71(local_20._1_7_,bVar2);
  local_34[0] = true;
  bVar2 = QTest::qCompare<bool,bool>
                    ((bool *)&local_20,local_34,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0xd3);
  if (bVar2) {
    local_20 = (code *)CONCAT44(local_20._4_4_,0xffffffff);
    local_34[0] = true;
    local_34[1] = false;
    local_34[2] = false;
    local_34[3] = false;
    iVar3 = waitForValue<int>(&p,(int *)&local_20,(int *)local_34);
    QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1, 42)","42",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                    ,0xd4);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_helpers_connect::rejectTwoSendersDestroyed()
{
    auto s0 = new Object{};
    auto s1 = new Object{};

    QtPromisePrivate::qtpromise_defer([&]() {
        QObject::connect(s1, &QObject::destroyed, [&]() {
            // Let's first delete s1, then resolve s0 and make sure
            // we don't reject when the rejecter object is destroyed.
            Q_EMIT s0->noArgSignal();
        });

        s1->deleteLater();
    });

    auto p = QtPromise::connect(s0, &Object::noArgSignal, s1, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
}